

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::data<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  size_t sVar1;
  bool bVar2;
  MemoryIdxT *pMVar3;
  MemoryIdxT *data;
  string_view expected;
  string_view expected_00;
  Name name;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  undefined1 local_e0 [8];
  MaybeResult<wasm::Ok> mem;
  size_t local_b0;
  string local_a8 [32];
  undefined1 local_88 [8];
  Result<std::vector<char,_std::allocator<char>_>_> str;
  Result<wasm::Ok> _val_1;
  
  sVar1 = (ctx->in).pos;
  expected._M_str = "data";
  expected._M_len = 4;
  bVar2 = Lexer::takeSExprStart(&ctx->in,expected);
  if (!bVar2) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)local_e0,&ctx->in);
  if (mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._8_1_ == '\0') {
    mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_index = '\0';
    mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._33_7_ = 0;
    local_b0 = 0;
  }
  else {
    mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ =
         mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._0_8_;
    local_b0 = (size_t)local_e0;
  }
  maybeMemuse<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_e0,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88,
             (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_e0);
  if (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<char>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ == '\x02') {
    std::__cxx11::string::string
              ((string *)
               ((long)&str.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
               (string *)local_88);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               (__index_type *)
               ((long)&str.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
LAB_00c06f64:
    std::__cxx11::string::~string
              ((string *)
               ((long)&str.val.
                       super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                       super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                       super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                       super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
    expected_00._M_str = "offset";
    expected_00._M_len = 6;
    bVar2 = Lexer::takeSExprStart(&ctx->in,expected_00);
    if (bVar2) {
      expr<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_88,ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&str.val.
                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  (local_a8,(string *)
                            ((long)&str.val.
                                    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                    .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_a8);
        std::__cxx11::string::~string(local_a8);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        bVar2 = Lexer::takeRParen(&ctx->in);
        if (bVar2) {
LAB_00c07058:
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                    ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = 1;
          goto LAB_00c07066;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"expected end of offset expression",
                   (allocator<char> *)local_a8);
        Lexer::err((Err *)((long)&str.val.
                                  super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                  .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                  super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                  super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                  super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
                   &ctx->in,&local_160);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        std::__cxx11::string::~string((string *)&local_160);
      }
    }
    else {
      bVar2 = Lexer::takeLParen(&ctx->in);
      if (!bVar2) {
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = 0;
LAB_00c07066:
        if ((mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') ||
           (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ != '\0')) {
          datastring<wasm::WATParser::ParseDeclsCtx>
                    ((Result<std::vector<char,_std::allocator<char>_>_> *)local_88,ctx);
          std::__detail::__variant::
          _Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          _Copy_ctor_base((_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                           *)((long)&str.val.
                                     super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                     .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                     super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                     super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                     super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
                          (_Copy_ctor_base<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                           *)local_88);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
            std::__cxx11::string::string
                      (local_a8,(string *)
                                ((long)&str.val.
                                        super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                        .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20)
                      );
            std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
            _Variant_storage<2ul,wasm::Err>
                      ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                       __return_storage_ptr__,local_a8);
            std::__cxx11::string::~string(local_a8);
            std::__detail::__variant::
            _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               *)((long)&str.val.
                                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                         .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20
                                 ));
          }
          else {
            std::__detail::__variant::
            _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                               *)((long)&str.val.
                                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                         .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20
                                 ));
            bVar2 = Lexer::takeRParen(&ctx->in);
            if (bVar2) {
              pMVar3 = (MemoryIdxT *)local_e0;
              if (mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._M_u._24_1_ != '\0')
              {
                pMVar3 = (MemoryIdxT *)0x0;
              }
              data = (MemoryIdxT *)local_88;
              if (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                  super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                  super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                  super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                  super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
                  super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ != '\0') {
                data = (MemoryIdxT *)0x0;
              }
              name.super_IString.str._M_str =
                   (char *)mem.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
              name.super_IString.str._M_len = local_b0;
              ParseDeclsCtx::addData
                        ((Result<wasm::Ok> *)
                         ((long)&str.val.
                                 super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),ctx,
                         name,pMVar3,
                         (optional<wasm::Ok>)
                         ((ushort)(byte)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ <<
                         8),(vector<char,_std::allocator<char>_> *)data,(Index)sVar1);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
                std::__cxx11::string::string
                          (local_a8,(string *)
                                    ((long)&str.val.
                                            super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                            .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                            super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                            super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                            super__Copy_ctor_alias<std::vector<char>,_wasm::Err> +
                                    0x20));
                std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
                _Variant_storage<2ul,wasm::Err>
                          ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                           __return_storage_ptr__,local_a8);
                std::__cxx11::string::~string(local_a8);
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                  ((long)&str.val.
                                          super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                          .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                          super__Copy_ctor_alias<std::vector<char>,_wasm::Err> +
                                  0x20));
              }
              else {
                std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
                ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                                  ((long)&str.val.
                                          super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                          .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                          super__Copy_ctor_alias<std::vector<char>,_wasm::Err> +
                                  0x20));
                *(__index_type *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) =
                     '\0';
              }
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_100,"expected end of data segment",
                         (allocator<char> *)local_a8);
              Lexer::err((Err *)((long)&str.val.
                                        super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                        .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                        super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                        super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20)
                         ,&ctx->in,&local_100);
              std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
              _Variant_storage<2ul,wasm::Err>
                        ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                         __return_storage_ptr__,
                         (__index_type *)
                         ((long)&str.val.
                                 super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
              std::__cxx11::string::~string
                        ((string *)
                         ((long)&str.val.
                                 super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                 .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                 super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                 super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
              std::__cxx11::string::~string((string *)&local_100);
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             *)local_88);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"expected offset for active segment",
                     (allocator<char> *)
                     ((long)&str.val.
                             super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                             .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                             super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                             super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                             super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
          Lexer::err((Err *)local_88,&ctx->in,&local_120);
          std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
          _Variant_storage<2ul,wasm::Err>
                    ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__
                     ,local_88);
          std::__cxx11::string::~string((string *)local_88);
          std::__cxx11::string::~string((string *)&local_120);
        }
        goto LAB_00c0734e;
      }
      instr<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_88,ctx);
      if (str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
          super__Move_assign_alias<std::vector<char>,_wasm::Err>.
          super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
          super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
          super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ == '\x02') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
                   (string *)local_88);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        goto LAB_00c06f64;
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_88);
      str.val.super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
      super__Move_assign_alias<std::vector<char>,_wasm::Err>.
      super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
      super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Copy_ctor_alias<std::vector<char>,_wasm::Err>.
      super__Variant_storage_alias<std::vector<char>,_wasm::Err>._M_u._24_1_ = 0;
      std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
                ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&str.val.
                         super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                         super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                         super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                         super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
                 (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_88);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  (local_a8,(string *)
                            ((long)&str.val.
                                    super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                    .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                    super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                    super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                    super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   local_a8);
        std::__cxx11::string::~string(local_a8);
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        bVar2 = Lexer::takeRParen(&ctx->in);
        if (bVar2) goto LAB_00c07058;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"expected end of offset instruction",
                   (allocator<char> *)local_a8);
        Lexer::err((Err *)((long)&str.val.
                                  super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>
                                  .super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                                  super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                                  super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                                  super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20),
                   &ctx->in,&local_140);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
                   (__index_type *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&str.val.
                           super__Variant_base<std::vector<char,_std::allocator<char>_>,_wasm::Err>.
                           super__Move_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_assign_alias<std::vector<char>,_wasm::Err>.
                           super__Move_ctor_alias<std::vector<char>,_wasm::Err>.
                           super__Copy_ctor_alias<std::vector<char>,_wasm::Err> + 0x20));
        std::__cxx11::string::~string((string *)&local_140);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_88);
  }
LAB_00c0734e:
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> data(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("data"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto mem = maybeMemuse(ctx);
  CHECK_ERR(mem);

  std::optional<typename Ctx::ExprT> offset;
  if (ctx.in.takeSExprStart("offset"sv)) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
    offset = *e;
  } else if (ctx.in.takeLParen()) {
    CHECK_ERR(instr(ctx));
    auto offsetExpr = ctx.makeExpr();
    CHECK_ERR(offsetExpr);
    offset = *offsetExpr;
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset instruction");
    }
  }

  if (mem && !offset) {
    return ctx.in.err("expected offset for active segment");
  }

  auto str = datastring(ctx);
  CHECK_ERR(str);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of data segment");
  }

  CHECK_ERR(ctx.addData(name, mem.getPtr(), offset, std::move(*str), pos));

  return Ok{};
}